

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *node;
  LibraryIncludeStatementSyntax *pLVar1;
  Token *unaff_retaddr;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_00000068;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000070;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  Token *args_3;
  
  args_3 = (Token *)__child_stack;
  node = deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000070,in_stack_00000068);
  parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  not_null<slang::syntax::FilePathSpecSyntax_*>::operator*
            ((not_null<slang::syntax::FilePathSpecSyntax_*> *)0x284a7a);
  deepClone<slang::syntax::FilePathSpecSyntax>
            ((FilePathSpecSyntax *)node,(BumpAllocator *)__child_stack);
  parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  pLVar1 = BumpAllocator::
           emplace<slang::syntax::LibraryIncludeStatementSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::FilePathSpecSyntax&,slang::parsing::Token>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,(FilePathSpecSyntax *)__fn,
                      args_3);
  return (int)pLVar1;
}

Assistant:

static SyntaxNode* clone(const LibraryIncludeStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<LibraryIncludeStatementSyntax>(
        *deepClone(node.attributes, alloc),
        node.include.deepClone(alloc),
        *deepClone<FilePathSpecSyntax>(*node.filePath, alloc),
        node.semi.deepClone(alloc)
    );
}